

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar9;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 local_90;
  float local_88;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ImVec2 local_38;
  ImVec2 local_30;
  
  if ((x_end_norm == x_start_norm) && (!NAN(x_end_norm) && !NAN(x_start_norm))) {
    return;
  }
  fVar9 = x_end_norm;
  if (x_start_norm <= x_end_norm) {
    fVar9 = x_start_norm;
    x_start_norm = x_end_norm;
  }
  fVar8 = (rect->Min).x;
  local_78 = (rect->Min).y;
  fVar12 = (rect->Max).x - fVar8;
  local_68 = fVar9 * fVar12 + fVar8;
  fVar11 = x_start_norm * fVar12 + fVar8;
  fVar9 = (rect->Max).y;
  local_38.x = fVar11;
  local_38.y = fVar9;
  local_30.x = local_68;
  local_30.y = local_78;
  if ((rounding != 0.0) || (NAN(rounding))) {
    fVar10 = (fVar9 - local_78) * 0.5;
    fVar13 = fVar12 * 0.5;
    if (fVar10 <= fVar12 * 0.5) {
      fVar13 = fVar10;
    }
    fVar13 = fVar13 + -1.0;
    if (fVar13 <= rounding) {
      rounding = fVar13;
    }
    local_88 = (float)(~-(uint)(fVar13 < 0.0) & (uint)rounding);
    fVar13 = 1.0 / local_88;
    fVar8 = 1.0 - (local_68 - fVar8) * fVar13;
    fVar12 = 1.5707964;
    uStack_64 = in_XMM1_Db;
    uStack_60 = in_XMM1_Dc;
    uStack_5c = in_XMM1_Dd;
    if ((0.0 < fVar8) && (fVar12 = 0.0, fVar8 < 1.0)) {
      fVar12 = acosf(fVar8);
    }
    fVar10 = 1.5707964;
    fVar8 = 1.0 - (fVar11 - (rect->Min).x) * fVar13;
    if ((0.0 < fVar8) && (fVar10 = 0.0, fVar8 < 1.0)) {
      fVar10 = acosf(fVar8);
    }
    fVar8 = (rect->Min).x + local_88;
    uVar7 = -(uint)(fVar8 <= local_68);
    fVar8 = (float)(uVar7 & (uint)local_68 | ~uVar7 & (uint)fVar8);
    if ((fVar12 != fVar10) || (NAN(fVar12) || NAN(fVar10))) {
      local_90.y = fVar9 - local_88;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      local_90.x = fVar8;
      if ((fVar12 != 0.0) || (((NAN(fVar12) || (fVar10 != 1.5707964)) || (NAN(fVar10))))) {
        local_4c = fVar10;
        local_48 = fVar8;
        ImDrawList::PathArcTo(draw_list,&local_90,local_88,3.1415927 - fVar10,3.1415927 - fVar12,3);
        local_90.y = local_78 + local_88;
        local_90.x = local_48;
        ImDrawList::PathArcTo
                  (draw_list,&local_90,local_88,fVar12 + 3.1415927,local_4c + 3.1415927,3);
      }
      else {
        local_48 = fVar8;
        ImDrawList::PathArcToFast(draw_list,&local_90,local_88,3,6);
        local_90.y = local_78 + local_88;
        local_90.x = local_48;
        ImDrawList::PathArcToFast(draw_list,&local_90,local_88,6,9);
      }
    }
    else {
      iVar4 = (draw_list->_Path).Size;
      iVar5 = (draw_list->_Path).Capacity;
      uVar17 = 0;
      uVar18 = 0;
      uVar19 = 0;
      if (iVar4 == iVar5) {
        iVar4 = iVar4 + 1;
        if (iVar5 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar5 / 2 + iVar5;
        }
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        if (iVar5 < iVar4) {
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_48 = fVar8;
          pIVar2 = (ImVec2 *)MemAlloc((long)iVar4 << 3);
          pIVar1 = (draw_list->_Path).Data;
          if (pIVar1 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar2;
          (draw_list->_Path).Capacity = iVar4;
          fVar8 = local_48;
          uVar17 = uStack_44;
          uVar18 = uStack_40;
          uVar19 = uStack_3c;
        }
      }
      pIVar1 = (draw_list->_Path).Data;
      iVar4 = (draw_list->_Path).Size;
      pIVar1[iVar4].x = fVar8;
      pIVar1[iVar4].y = fVar9;
      iVar5 = (draw_list->_Path).Size;
      iVar3 = (draw_list->_Path).Capacity;
      iVar4 = iVar5 + 1;
      (draw_list->_Path).Size = iVar4;
      if (iVar4 == iVar3) {
        iVar5 = iVar5 + 2;
        if (iVar3 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar3 / 2 + iVar3;
        }
        if (iVar5 < iVar4) {
          iVar5 = iVar4;
        }
        if (iVar3 < iVar5) {
          local_48 = fVar8;
          uStack_44 = uVar17;
          uStack_40 = uVar18;
          uStack_3c = uVar19;
          pIVar2 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
          pIVar1 = (draw_list->_Path).Data;
          if (pIVar1 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
            MemFree((draw_list->_Path).Data);
          }
          (draw_list->_Path).Data = pIVar2;
          (draw_list->_Path).Capacity = iVar5;
          fVar8 = local_48;
        }
      }
      pIVar1 = (draw_list->_Path).Data;
      iVar4 = (draw_list->_Path).Size;
      pIVar1[iVar4].x = fVar8;
      pIVar1[iVar4].y = local_78;
      (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    }
    if ((rect->Min).x + local_88 < fVar11) {
      fVar12 = 1.0 - ((rect->Max).x - fVar11) * fVar13;
      fVar8 = 1.5707964;
      uVar17 = 0;
      uVar18 = 0;
      uVar19 = 0;
      if (0.0 < fVar12) {
        fVar8 = 0.0;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        if (fVar12 < 1.0) {
          fVar8 = acosf(fVar12);
          uVar17 = extraout_XMM0_Db;
          uVar18 = extraout_XMM0_Dc;
          uVar19 = extraout_XMM0_Dd;
        }
      }
      uVar16 = 0;
      uVar15 = 0;
      uVar14 = 0;
      fVar12 = 1.5707964;
      fVar13 = 1.0 - ((rect->Max).x - local_68) * fVar13;
      if (0.0 < fVar13) {
        fVar12 = 0.0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        if (fVar13 < 1.0) {
          local_68 = fVar8;
          uStack_64 = uVar17;
          uStack_60 = uVar18;
          uStack_5c = uVar19;
          fVar12 = acosf(fVar13);
          fVar8 = local_68;
          uVar17 = uStack_64;
          uVar18 = uStack_60;
          uVar19 = uStack_5c;
          uVar14 = extraout_XMM0_Db_00;
          uVar15 = extraout_XMM0_Dc_00;
          uVar16 = extraout_XMM0_Dd_00;
        }
      }
      fVar13 = (rect->Max).x - local_88;
      if (fVar13 <= fVar11) {
        fVar11 = fVar13;
      }
      if ((fVar8 != fVar12) || (NAN(fVar8) || NAN(fVar12))) {
        local_90.y = local_78 + local_88;
        local_90.x = fVar11;
        if (((fVar8 != 0.0) || ((NAN(fVar8) || (fVar12 != 1.5707964)))) || (NAN(fVar12))) {
          local_78 = fVar12;
          uStack_74 = uVar14;
          uStack_70 = uVar15;
          uStack_6c = uVar16;
          local_68 = fVar8;
          uStack_64 = uVar17;
          uStack_60 = uVar18;
          uStack_5c = uVar19;
          ImDrawList::PathArcTo(draw_list,&local_90,local_88,-fVar12,-fVar8,3);
          local_90.y = fVar9 - local_88;
          local_90.x = fVar11;
          ImDrawList::PathArcTo(draw_list,&local_90,local_88,local_68,local_78,3);
        }
        else {
          ImDrawList::PathArcToFast(draw_list,&local_90,local_88,9,0xc);
          local_90.y = fVar9 - local_88;
          local_90.x = fVar11;
          ImDrawList::PathArcToFast(draw_list,&local_90,local_88,0,3);
        }
      }
      else {
        iVar4 = (draw_list->_Path).Size;
        iVar5 = (draw_list->_Path).Capacity;
        if (iVar4 == iVar5) {
          iVar4 = iVar4 + 1;
          if (iVar5 == 0) {
            iVar3 = 8;
          }
          else {
            iVar3 = iVar5 / 2 + iVar5;
          }
          if (iVar4 < iVar3) {
            iVar4 = iVar3;
          }
          if (iVar5 < iVar4) {
            pIVar2 = (ImVec2 *)MemAlloc((long)iVar4 << 3);
            pIVar1 = (draw_list->_Path).Data;
            if (pIVar1 != (ImVec2 *)0x0) {
              memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
              MemFree((draw_list->_Path).Data);
            }
            (draw_list->_Path).Data = pIVar2;
            (draw_list->_Path).Capacity = iVar4;
          }
        }
        pIVar1 = (draw_list->_Path).Data;
        iVar4 = (draw_list->_Path).Size;
        pIVar1[iVar4].x = fVar11;
        pIVar1[iVar4].y = local_78;
        iVar4 = (draw_list->_Path).Size;
        iVar5 = (draw_list->_Path).Capacity;
        iVar3 = iVar4 + 1;
        (draw_list->_Path).Size = iVar3;
        if (iVar3 == iVar5) {
          iVar4 = iVar4 + 2;
          if (iVar5 == 0) {
            iVar3 = 8;
          }
          else {
            iVar3 = iVar5 / 2 + iVar5;
          }
          if (iVar4 < iVar3) {
            iVar4 = iVar3;
          }
          if (iVar5 < iVar4) {
            pIVar2 = (ImVec2 *)MemAlloc((long)iVar4 << 3);
            pIVar1 = (draw_list->_Path).Data;
            if (pIVar1 != (ImVec2 *)0x0) {
              memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
              MemFree((draw_list->_Path).Data);
            }
            (draw_list->_Path).Data = pIVar2;
            (draw_list->_Path).Capacity = iVar4;
          }
        }
        pIVar1 = (draw_list->_Path).Data;
        iVar4 = (draw_list->_Path).Size;
        pIVar1[iVar4].x = fVar11;
        pIVar1[iVar4].y = fVar9;
        (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
      }
    }
    ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col);
    iVar4 = (draw_list->_Path).Capacity;
    if (iVar4 < 0) {
      uVar7 = iVar4 / 2 + iVar4;
      uVar6 = 0;
      if (0 < (int)uVar7) {
        uVar6 = (ulong)uVar7;
      }
      pIVar2 = (ImVec2 *)MemAlloc(uVar6 * 8);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar2;
      (draw_list->_Path).Capacity = (int)uVar6;
    }
    (draw_list->_Path).Size = 0;
  }
  else if (0xffffff < col) {
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_30,&local_38,col);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == IM_PI*0.5f)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b, 3); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e, 3); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == IM_PI*0.5f)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b, 3); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e, 3); // BR
        }
    }
    draw_list->PathFillConvex(col);
}